

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  size_t sVar1;
  ushort *puVar2;
  int iVar3;
  size_t len;
  long extraout_RDX;
  ptls_buffer_t *buf_00;
  ulong uVar4;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  uVar4 = (long)size >> 0x3f & size;
  for (; (len = uVar4, 0 < (long)size && (len = size, *bignum == '\0'));
      bignum = (void *)((long)bignum + 1)) {
    size = size - 1;
  }
  local_29 = 2;
  iVar3 = ptls_buffer__do_pushv(buf,&local_29,1);
  if (iVar3 == 0) {
    local_2a = 0xff;
    iVar3 = ptls_buffer__do_pushv(buf,&local_2a,1);
    if (iVar3 == 0) {
      sVar1 = buf->off;
      if (*bignum < '\0') {
        local_2b = 0;
        iVar3 = ptls_buffer__do_pushv(buf,&local_2b,1);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      if (size == 0) {
        bignum = "";
        len = 1;
      }
      buf_00 = buf;
      iVar3 = ptls_buffer__do_pushv(buf,bignum,len);
      if (iVar3 == 0) {
        uVar4 = buf->off - sVar1;
        if (0x7f < uVar4) {
          ptls_buffer__adjust_asn1_blocksize(buf_00,(size_t)bignum);
          puVar2 = *bignum;
          if (extraout_RDX - (long)puVar2 < 2) {
            return 0x32;
          }
          *(ushort *)&buf_00->base = *puVar2 << 8 | *puVar2 >> 8;
          *(ushort **)bignum = puVar2 + 1;
          return 0;
        }
        buf->base[sVar1 - 1] = (uint8_t)uVar4;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *const end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}